

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

bool PrngTest<Blob<224>>(hashfunc<Blob<224>_> hash,bool testColl,bool testDist,bool drawDiagram)

{
  bool bVar1;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> hashes;
  
  hashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  hashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  hashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  Prn_gen<Blob<224>>(0x2000000,hash.m_hash,&hashes);
  bVar1 = TestHashList<Blob<224>>(&hashes,drawDiagram,testColl,testDist,true,true);
  std::_Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>::~_Vector_base
            (&hashes.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>);
  return bVar1;
}

Assistant:

bool PrngTest ( hashfunc<hashtype> hash,
                bool testColl, bool testDist, bool drawDiagram )
{

  if (sizeof(hashtype) < 8) {
      printf("The PRNG test is designed for hashes >= 64-bit \n");
      return true;
  }

  //----------

  std::vector<hashtype> hashes;
  Prn_gen(32 << 20, hash, hashes);

  //----------

  bool result = true;

  result &= TestHashList(hashes,drawDiagram,testColl,testDist);

  return result;
}